

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O1

eddsa_key_material_t * crypto_malloc_eddsa(EVP_PKEY *pkey)

{
  int iVar1;
  int iVar2;
  uchar *in_RAX;
  eddsa_key_material_t *keyMat;
  ASN1_OBJECT *pAVar3;
  uchar *puVar4;
  void *pvVar5;
  void *pvVar6;
  size_t __size;
  uchar *p;
  uchar *local_38;
  
  if (pkey == (EVP_PKEY *)0x0) {
    return (eddsa_key_material_t *)0x0;
  }
  local_38 = in_RAX;
  keyMat = (eddsa_key_material_t *)calloc(1,0x30);
  if (keyMat == (eddsa_key_material_t *)0x0) {
    return (eddsa_key_material_t *)0x0;
  }
  iVar1 = EVP_PKEY_get_id(pkey);
  pAVar3 = OBJ_nid2obj(iVar1);
  iVar2 = i2d_ASN1_OBJECT(pAVar3,(uchar **)0x0);
  *(long *)keyMat = (long)iVar2;
  puVar4 = (uchar *)malloc((long)iVar2);
  *(uchar **)(keyMat + 0x18) = puVar4;
  __size = 0x20;
  if (iVar1 < 0x43f) {
    if (iVar1 != 0x40a) {
      if (iVar1 != 0x40b) goto LAB_00117064;
      __size = 0x38;
    }
  }
  else if (iVar1 != 0x43f) {
    if (iVar1 != 0x440) goto LAB_00117064;
    __size = 0x39;
  }
  *(size_t *)(keyMat + 8) = __size;
  *(size_t *)(keyMat + 0x10) = __size;
  pvVar5 = malloc(__size);
  *(void **)(keyMat + 0x20) = pvVar5;
  pvVar6 = malloc(__size);
  *(void **)(keyMat + 0x28) = pvVar6;
  if ((puVar4 != (uchar *)0x0) && (pvVar5 != (void *)0x0 && pvVar6 != (void *)0x0)) {
    local_38 = puVar4;
    pAVar3 = OBJ_nid2obj(iVar1);
    iVar1 = i2d_ASN1_OBJECT(pAVar3,&local_38);
    if (0 < iVar1) {
      iVar1 = i2d_PUBKEY((EVP_PKEY *)pkey,(uchar **)0x0);
      if ((*(long *)(keyMat + 0x10) + 0xcU == (long)iVar1) &&
         (puVar4 = (uchar *)malloc((long)iVar1), puVar4 != (uchar *)0x0)) {
        local_38 = puVar4;
        i2d_PUBKEY((EVP_PKEY *)pkey,&local_38);
        memcpy(*(void **)(keyMat + 0x28),puVar4 + 0xc,*(size_t *)(keyMat + 0x10));
        free(puVar4);
        iVar1 = i2d_PrivateKey((EVP_PKEY *)pkey,(uchar **)0x0);
        if ((*(long *)(keyMat + 8) + 0x10U == (long)iVar1) &&
           (puVar4 = (uchar *)malloc((long)iVar1), puVar4 != (uchar *)0x0)) {
          local_38 = puVar4;
          i2d_PrivateKey((EVP_PKEY *)pkey,&local_38);
          memcpy(*(void **)(keyMat + 0x20),puVar4 + 0x10,*(size_t *)(keyMat + 8));
          free(puVar4);
          return keyMat;
        }
      }
    }
  }
LAB_00117064:
  crypto_free_eddsa(keyMat);
  return (eddsa_key_material_t *)0x0;
}

Assistant:

eddsa_key_material_t* crypto_malloc_eddsa(EVP_PKEY* pkey)
{
	int result;
	int len;
	unsigned char *buf;

	if (pkey == NULL)
	{
		return NULL;
	}

	eddsa_key_material_t* keyMat = (eddsa_key_material_t*)calloc(1, sizeof(eddsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	int nid = EVP_PKEY_id(pkey);
	keyMat->sizeOID = i2d_ASN1_OBJECT(OBJ_nid2obj(nid), NULL);
	keyMat->derOID = (CK_VOID_PTR)malloc(keyMat->sizeOID);

	switch (nid) {
	case NID_X25519:
	case NID_ED25519:
		keyMat->sizeK = X25519_KEYLEN;
		keyMat->sizeA = X25519_KEYLEN;
		break;
	case NID_X448:
		keyMat->sizeK = X448_KEYLEN;
		keyMat->sizeA = X448_KEYLEN;
		break;
	case NID_ED448:
		keyMat->sizeK = ED448_KEYLEN;
		keyMat->sizeA = ED448_KEYLEN;
		break;
	default:
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	keyMat->bigK = (CK_VOID_PTR)malloc(keyMat->sizeK);
	keyMat->bigA = (CK_VOID_PTR)malloc(keyMat->sizeA);
	if (!keyMat->derOID || !keyMat->bigK || !keyMat->bigA)
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}

	unsigned char *p = (unsigned char*) keyMat->derOID;
	result = i2d_ASN1_OBJECT(OBJ_nid2obj(nid), &p);
	if (result <= 0)
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}

	len = i2d_PUBKEY(pkey, NULL);
	if (((CK_ULONG) len != PUBPREFIXLEN + keyMat->sizeA) ||
	    ((buf = (unsigned char*) malloc(len)) == NULL))
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	p = buf;
	i2d_PUBKEY(pkey, &p);
	memcpy(keyMat->bigA, buf + PUBPREFIXLEN, keyMat->sizeA);
	free(buf);

	len = i2d_PrivateKey(pkey, NULL);
	if (((CK_ULONG) len != PRIVPREFIXLEN + keyMat->sizeK) ||
	    ((buf = (unsigned char*) malloc(len)) == NULL))
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	p = buf;
	i2d_PrivateKey(pkey, &p);
	memcpy(keyMat->bigK, buf + PRIVPREFIXLEN, keyMat->sizeK);
	free(buf);

	return keyMat;
}